

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long mkvparser::Cluster::HasBlockEntries(Segment *pSegment,longlong off,longlong *pos,long *len)

{
  int iVar1;
  IMkvReader *pReader_00;
  IMkvReader *pos_00;
  IMkvReader *pReader_01;
  longlong lVar2;
  long *in_RCX;
  long *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  longlong unknown_size_1;
  longlong size_1;
  longlong id_1;
  longlong result_1;
  longlong unknown_size;
  longlong size;
  longlong id;
  longlong result;
  longlong cluster_stop;
  longlong segment_stop;
  long status;
  longlong avail;
  longlong total;
  IMkvReader *pReader;
  long local_a0;
  long *in_stack_ffffffffffffff68;
  long *in_stack_ffffffffffffff70;
  IMkvReader *in_stack_ffffffffffffff78;
  longlong in_stack_ffffffffffffff80;
  IMkvReader *in_stack_ffffffffffffff88;
  longlong in_stack_ffffffffffffff90;
  IMkvReader *in_stack_ffffffffffffff98;
  long local_58;
  long local_40;
  long local_38;
  long *local_30;
  long *local_28;
  long *local_20;
  long local_18;
  undefined8 *local_10;
  IMkvReader *local_8;
  
  local_30 = (long *)*in_RDI;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar1 = (**(code **)(*local_30 + 8))(local_30,&local_38,&local_40);
  local_8 = (IMkvReader *)(long)iVar1;
  if (-1 < (long)local_8) {
    *local_20 = local_10[2] + local_18;
    if ((local_38 < 0) || (*local_20 < local_38)) {
      if ((long)local_10[3] < 0) {
        local_a0 = -1;
      }
      else {
        local_a0 = local_10[2] + local_10[3];
      }
      local_58 = -1;
      if (local_40 < *local_20 + 1) {
        *local_28 = 1;
        local_8 = (IMkvReader *)0xfffffffffffffffd;
      }
      else {
        local_8 = (IMkvReader *)
                  GetUIntLength(in_stack_ffffffffffffff78,(longlong)in_stack_ffffffffffffff70,
                                in_stack_ffffffffffffff68);
        if (-1 < (long)local_8) {
          if ((long)local_8 < 1) {
            if ((local_a0 < 0) || (*local_20 + *local_28 <= local_a0)) {
              if ((local_38 < 0) || (*local_20 + *local_28 <= local_38)) {
                if (local_40 < *local_20 + *local_28) {
                  local_8 = (IMkvReader *)0xfffffffffffffffd;
                }
                else {
                  pReader_00 = (IMkvReader *)
                               ReadID(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                                      (long *)in_stack_ffffffffffffff88);
                  local_8 = pReader_00;
                  if (-1 < (long)pReader_00) {
                    if (pReader_00 == (IMkvReader *)0x1f43b675) {
                      *local_20 = *local_28 + *local_20;
                      if (local_40 < *local_20 + 1) {
                        *local_28 = 1;
                        local_8 = (IMkvReader *)0xfffffffffffffffd;
                      }
                      else {
                        local_8 = (IMkvReader *)
                                  GetUIntLength(in_stack_ffffffffffffff78,
                                                (longlong)in_stack_ffffffffffffff70,
                                                in_stack_ffffffffffffff68);
                        if (-1 < (long)local_8) {
                          if ((long)local_8 < 1) {
                            if ((local_a0 < 0) || (*local_20 + *local_28 <= local_a0)) {
                              if ((local_38 < 0) || (*local_20 + *local_28 <= local_38)) {
                                if (local_40 < *local_20 + *local_28) {
                                  local_8 = (IMkvReader *)0xfffffffffffffffd;
                                }
                                else {
                                  pos_00 = (IMkvReader *)
                                           ReadUInt(in_stack_ffffffffffffff88,
                                                    in_stack_ffffffffffffff80,
                                                    (long *)in_stack_ffffffffffffff78);
                                  local_8 = pos_00;
                                  if (-1 < (long)pos_00) {
                                    if (pos_00 == (IMkvReader *)0x0) {
                                      local_8 = (IMkvReader *)0x0;
                                    }
                                    else {
                                      *local_20 = *local_28 + *local_20;
                                      pReader_01 = (IMkvReader *)
                                                   ((1L << ((char)*local_28 * '\a' & 0x3fU)) + -1);
                                      if (pos_00 != pReader_01) {
                                        local_58 = (long)&pos_00->_vptr_IMkvReader + *local_20;
                                        if ((-1 < local_a0) && (local_a0 < local_58)) {
                                          return -2;
                                        }
                                        if ((-1 < local_38) && (local_38 < local_58)) {
                                          return 0;
                                        }
                                      }
                                      do {
                                        do {
                                          if ((-1 < local_58) && (local_58 <= *local_20)) {
                                            return 0;
                                          }
                                          if (local_40 < *local_20 + 1) {
                                            *local_28 = 1;
                                            return -3;
                                          }
                                          lVar2 = GetUIntLength(in_stack_ffffffffffffff78,
                                                                (longlong)in_stack_ffffffffffffff70,
                                                                in_stack_ffffffffffffff68);
                                          if (lVar2 < 0) {
                                            return lVar2;
                                          }
                                          if (0 < lVar2) {
                                            return -3;
                                          }
                                          if ((-1 < local_58) && (local_58 < *local_20 + *local_28))
                                          {
                                            return -2;
                                          }
                                          if (local_40 < *local_20 + *local_28) {
                                            return -3;
                                          }
                                          in_stack_ffffffffffffff78 =
                                               (IMkvReader *)
                                               ReadID(pReader_00,(longlong)pos_00,(long *)pReader_01
                                                     );
                                          if ((long)in_stack_ffffffffffffff78 < 0) {
                                            return (long)in_stack_ffffffffffffff78;
                                          }
                                          if (in_stack_ffffffffffffff78 == (IMkvReader *)0x1f43b675)
                                          {
                                            return 0;
                                          }
                                          if (in_stack_ffffffffffffff78 == (IMkvReader *)0x1c53bb6b)
                                          {
                                            return 0;
                                          }
                                          *local_20 = *local_28 + *local_20;
                                          if ((-1 < local_58) && (local_58 <= *local_20)) {
                                            return -2;
                                          }
                                          if (local_40 < *local_20 + 1) {
                                            *local_28 = 1;
                                            return -3;
                                          }
                                          lVar2 = GetUIntLength(in_stack_ffffffffffffff78,
                                                                (longlong)in_stack_ffffffffffffff70,
                                                                in_stack_ffffffffffffff68);
                                          if (lVar2 < 0) {
                                            return lVar2;
                                          }
                                          if (0 < lVar2) {
                                            return -3;
                                          }
                                          if ((-1 < local_58) && (local_58 < *local_20 + *local_28))
                                          {
                                            return -2;
                                          }
                                          if (local_40 < *local_20 + *local_28) {
                                            return -3;
                                          }
                                          in_stack_ffffffffffffff70 =
                                               (long *)ReadUInt(pReader_01,lVar2,
                                                                (long *)in_stack_ffffffffffffff78);
                                          if ((long)in_stack_ffffffffffffff70 < 0) {
                                            return (long)in_stack_ffffffffffffff70;
                                          }
                                          *local_20 = *local_28 + *local_20;
                                          if ((-1 < local_58) && (local_58 < *local_20)) {
                                            return -2;
                                          }
                                        } while (in_stack_ffffffffffffff70 == (long *)0x0);
                                        in_stack_ffffffffffffff68 =
                                             (long *)((1L << ((char)*local_28 * '\a' & 0x3fU)) + -1)
                                        ;
                                        if (in_stack_ffffffffffffff70 == in_stack_ffffffffffffff68)
                                        {
                                          return -2;
                                        }
                                        if ((-1 < local_58) &&
                                           (local_58 < (long)in_stack_ffffffffffffff70 + *local_20))
                                        {
                                          return -2;
                                        }
                                        if (in_stack_ffffffffffffff78 == (IMkvReader *)0xa0) {
                                          return 1;
                                        }
                                        if (in_stack_ffffffffffffff78 == (IMkvReader *)0xa3) {
                                          return 1;
                                        }
                                        *local_20 = (long)in_stack_ffffffffffffff70 + *local_20;
                                      } while ((local_58 < 0) || (*local_20 <= local_58));
                                      local_8 = (IMkvReader *)0xfffffffffffffffe;
                                    }
                                  }
                                }
                              }
                              else {
                                local_8 = (IMkvReader *)0x0;
                              }
                            }
                            else {
                              local_8 = (IMkvReader *)0xfffffffffffffffe;
                            }
                          }
                          else {
                            local_8 = (IMkvReader *)0xfffffffffffffffd;
                          }
                        }
                      }
                    }
                    else {
                      local_8 = (IMkvReader *)0xffffffffffffffff;
                    }
                  }
                }
              }
              else {
                local_8 = (IMkvReader *)0x0;
              }
            }
            else {
              local_8 = (IMkvReader *)0xfffffffffffffffe;
            }
          }
          else {
            local_8 = (IMkvReader *)0xfffffffffffffffd;
          }
        }
      }
    }
    else {
      local_8 = (IMkvReader *)0x0;
    }
  }
  return (long)local_8;
}

Assistant:

long Cluster::HasBlockEntries(
    const Segment* pSegment,
    long long off,  // relative to start of segment payload
    long long& pos, long& len) {
  assert(pSegment);
  assert(off >= 0);  // relative to segment

  IMkvReader* const pReader = pSegment->m_pReader;

  long long total, avail;

  long status = pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  assert((total < 0) || (avail <= total));

  pos = pSegment->m_start + off;  // absolute

  if ((total >= 0) && (pos >= total))
    return 0;  // we don't even have a complete cluster

  const long long segment_stop =
      (pSegment->m_size < 0) ? -1 : pSegment->m_start + pSegment->m_size;

  long long cluster_stop = -1;  // interpreted later to mean "unknown size"

  {
    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // need more data
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((total >= 0) && ((pos + len) > total))
      return 0;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long id = ReadID(pReader, pos, len);

    if (id < 0)  // error
      return static_cast<long>(id);

    if (id != libwebm::kMkvCluster)
      return E_PARSE_FAILED;

    pos += len;  // consume Cluster ID field

    // read size field

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((total >= 0) && ((pos + len) > total))
      return 0;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    if (size == 0)
      return 0;  // cluster does not have entries

    pos += len;  // consume size field

    // pos now points to start of payload

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if (size != unknown_size) {
      cluster_stop = pos + size;
      assert(cluster_stop >= 0);

      if ((segment_stop >= 0) && (cluster_stop > segment_stop))
        return E_FILE_FORMAT_INVALID;

      if ((total >= 0) && (cluster_stop > total))
        // return E_FILE_FORMAT_INVALID;  //too conservative
        return 0;  // cluster does not have any entries
    }
  }

  for (;;) {
    if ((cluster_stop >= 0) && (pos >= cluster_stop))
      return 0;  // no entries detected

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // need more data
      return E_BUFFER_NOT_FULL;

    if ((cluster_stop >= 0) && ((pos + len) > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long id = ReadID(pReader, pos, len);

    if (id < 0)  // error
      return static_cast<long>(id);

    // This is the distinguished set of ID's we use to determine
    // that we have exhausted the sub-element's inside the cluster
    // whose ID we parsed earlier.

    if (id == libwebm::kMkvCluster)
      return 0;  // no entries found

    if (id == libwebm::kMkvCues)
      return 0;  // no entries found

    pos += len;  // consume id field

    if ((cluster_stop >= 0) && (pos >= cluster_stop))
      return E_FILE_FORMAT_INVALID;

    // read size field

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // underflow
      return E_BUFFER_NOT_FULL;

    if ((cluster_stop >= 0) && ((pos + len) > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    pos += len;  // consume size field

    // pos now points to start of payload

    if ((cluster_stop >= 0) && (pos > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    if (size == 0)  // weird
      continue;

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if (size == unknown_size)
      return E_FILE_FORMAT_INVALID;  // not supported inside cluster

    if ((cluster_stop >= 0) && ((pos + size) > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    if (id == libwebm::kMkvBlockGroup)
      return 1;  // have at least one entry

    if (id == libwebm::kMkvSimpleBlock)
      return 1;  // have at least one entry

    pos += size;  // consume payload
    if (cluster_stop >= 0 && pos > cluster_stop)
      return E_FILE_FORMAT_INVALID;
  }
}